

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::IRContext::ReplaceAllUsesWithPredicate
          (IRContext *this,uint32_t before,uint32_t after,
          function<bool_(spvtools::opt::Instruction_*)> *predicate)

{
  pointer pOVar1;
  uint32_t uVar2;
  uint uVar3;
  Instruction *pIVar4;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char *message;
  undefined8 *puVar10;
  bool bVar11;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses_to_update;
  _Any_data local_88;
  PodType local_78 [2];
  code **ppcStack_70;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_68;
  Instruction *local_60;
  undefined8 *local_58;
  undefined8 *puStack_50;
  long local_48;
  undefined8 *local_38;
  ulong uVar5;
  
  if (before != after) {
    if ((this->valid_analyses_ & kAnalysisDebugInfo) != kAnalysisNone) {
      analysis::DebugInfoManager::ReplaceAllUsesInDebugScopeWithPredicate
                ((this->debug_info_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                 _M_head_impl,before,after,predicate);
    }
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      BuildDefUseManager(this);
    }
    pIVar4 = analysis::DefUseManager::GetDef
                       ((this->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,after);
    if (pIVar4 == (Instruction *)0x0) {
      __assert_fail("get_def_use_mgr()->GetDef(after) && \"\'after\' is not a registered def.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                    ,0x148,
                    "bool spvtools::opt::IRContext::ReplaceAllUsesWithPredicate(uint32_t, uint32_t, const std::function<bool (Instruction *)> &)"
                   );
    }
    local_58 = (undefined8 *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      BuildDefUseManager(this);
    }
    local_88._8_8_ = &local_58;
    ppcStack_70 = (code **)std::
                           _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
                           ::_M_invoke;
    local_78 = (PodType  [2])
               std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp:332:15)>
               ::_M_manager;
    local_88._M_unused._M_object = predicate;
    analysis::DefUseManager::ForEachUse
              ((this->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               before,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_88);
    if (local_78 != (PodType  [2])0x0) {
      (*(code *)local_78)(&local_88,&local_88,3);
    }
    local_38 = puStack_50;
    if (local_58 != puStack_50) {
      local_60 = (Instruction *)0x0;
      puVar10 = local_58;
      do {
        pIVar4 = (Instruction *)*puVar10;
        uVar3 = *(uint *)(puVar10 + 1);
        if (local_60 == (Instruction *)0x0 || local_60 != pIVar4) {
          ForgetUses(this,pIVar4);
          local_60 = pIVar4;
        }
        uVar7 = 0;
        uVar8 = 0;
        if (pIVar4->has_result_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(pIVar4,(uint)pIVar4->has_type_id_);
          uVar8 = (uint)(uVar2 != 0);
        }
        if (pIVar4->has_type_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(pIVar4,0);
          uVar7 = (uint)(uVar2 != 0);
        }
        if (uVar3 < uVar7 + uVar8) {
          if (pIVar4->has_type_id_ == true) {
            uVar2 = Instruction::GetSingleWordOperand(pIVar4,0);
            bVar11 = uVar2 != 0;
          }
          else {
            bVar11 = false;
          }
          if ((!bVar11) || (uVar3 != 0)) {
            if ((pIVar4->has_type_id_ == false) ||
               (uVar2 = Instruction::GetSingleWordOperand(pIVar4,0), uVar2 == 0)) {
              local_88._M_unused._M_member_pointer = 0x165;
              message = 
              "assertion failed: Result type id considered as use while the instruction doesn\'t have a result type id."
              ;
            }
            else {
              local_88._M_unused._M_member_pointer = 0x169;
              message = "assertion failed: Trying setting the immutable result id.";
            }
            local_78[0].data._M_elems = (array<signed_char,_4UL>)0x0;
            local_78[1].data._M_elems = (array<signed_char,_4UL>)0x0;
            local_88._8_8_ = 0;
            Log(&this->consumer_,SPV_MSG_INTERNAL_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_context.cpp"
                ,(spv_position_t *)&local_88,message);
            exit(1);
          }
          if (pIVar4->has_type_id_ == false) {
            __assert_fail("has_type_id_",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          if (after == 0) {
            __assert_fail("ty_id != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
          }
          local_88._M_unused._M_object = &PTR__SmallVector_009488e0;
          ppcStack_70 = (code **)local_78;
          local_68._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_78[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)after;
          local_88._8_8_ = (undefined8 **)0x1;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&((pIVar4->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start)->words,
                     (SmallVector<unsigned_int,_2UL> *)&local_88);
        }
        else {
          local_88._M_unused._M_object = &PTR__SmallVector_009488e0;
          ppcStack_70 = (code **)local_78;
          local_68._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            )0x0;
          local_78[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)after;
          local_88._8_8_ = (undefined8 **)0x1;
          uVar6 = (pIVar4->has_result_id_ & 1) + 1;
          if (pIVar4->has_type_id_ == false) {
            uVar6 = (uint)pIVar4->has_result_id_;
          }
          uVar3 = (uVar3 - (uVar7 + uVar8)) + uVar6;
          uVar5 = (ulong)uVar3;
          pOVar1 = (pIVar4->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = ((long)(pIVar4->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 4) *
                  -0x5555555555555555;
          if (uVar9 < uVar5 || uVar9 - uVar5 == 0) {
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          if (uVar3 < uVar6) {
            __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b9,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    (&pOVar1[uVar5].words,(SmallVector<unsigned_int,_2UL> *)&local_88);
        }
        local_88._M_unused._M_object = &PTR__SmallVector_009488e0;
        if (local_68._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_68,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     local_68._M_t.
                     super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     .
                     super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                     ._M_head_impl);
        }
        AnalyzeUses(this,pIVar4);
        puVar10 = puVar10 + 2;
      } while (puVar10 != local_38);
    }
    if (local_58 != (undefined8 *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  return before != after;
}

Assistant:

bool IRContext::ReplaceAllUsesWithPredicate(
    uint32_t before, uint32_t after,
    const std::function<bool(Instruction*)>& predicate) {
  if (before == after) return false;

  if (AreAnalysesValid(kAnalysisDebugInfo)) {
    get_debug_info_mgr()->ReplaceAllUsesInDebugScopeWithPredicate(before, after,
                                                                  predicate);
  }

  // Ensure that |after| has been registered as def.
  assert(get_def_use_mgr()->GetDef(after) &&
         "'after' is not a registered def.");

  std::vector<std::pair<Instruction*, uint32_t>> uses_to_update;
  get_def_use_mgr()->ForEachUse(
      before, [&predicate, &uses_to_update](Instruction* user, uint32_t index) {
        if (predicate(user)) {
          uses_to_update.emplace_back(user, index);
        }
      });

  Instruction* prev = nullptr;
  for (auto p : uses_to_update) {
    Instruction* user = p.first;
    uint32_t index = p.second;
    if (prev == nullptr || prev != user) {
      ForgetUses(user);
      prev = user;
    }
    const uint32_t type_result_id_count =
        (user->result_id() != 0) + (user->type_id() != 0);

    if (index < type_result_id_count) {
      // Update the type_id. Note that result id is immutable so it should
      // never be updated.
      if (user->type_id() != 0 && index == 0) {
        user->SetResultType(after);
      } else if (user->type_id() == 0) {
        SPIRV_ASSERT(consumer_, false,
                     "Result type id considered as use while the instruction "
                     "doesn't have a result type id.");
        (void)consumer_;  // Makes the compiler happy for release build.
      } else {
        SPIRV_ASSERT(consumer_, false,
                     "Trying setting the immutable result id.");
      }
    } else {
      // Update an in-operand.
      uint32_t in_operand_pos = index - type_result_id_count;
      // Make the modification in the instruction.
      user->SetInOperand(in_operand_pos, {after});
    }
    AnalyzeUses(user);
  }
  return true;
}